

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_CfdConvertScriptAsmToHex_SimpleScript_TEST_Test::
cfdcapi_script_CfdConvertScriptAsmToHex_SimpleScript_TEST_Test
          (cfdcapi_script_CfdConvertScriptAsmToHex_SimpleScript_TEST_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)&PTR__cfdcapi_script_CfdConvertScriptAsmToHex_SimpleScript_TEST_Test_009f5330;
  return;
}

Assistant:

TEST(cfdcapi_script, CfdConvertScriptAsmToHex_SimpleScript_TEST) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  // OP_9 OP_15 OP_ADD 24 OP_EQUAL 
  const char* script_asm = "OP_9 OP_15 OP_ADD 24 OP_EQUAL ";
  char* script_hex;

  ret = CfdConvertScriptAsmToHex(handle, script_asm, &script_hex);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    EXPECT_STREQ(script_hex, "595f93011887");
    CfdFreeStringBuffer(script_hex);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}